

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall Catch::ConsoleReporter::printSummaryDivider(ConsoleReporter *this)

{
  ostream *poVar1;
  undefined8 in_RAX;
  size_t sVar2;
  undefined8 uStack_18;
  
  poVar1 = (ostream *)(this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream;
  if (getLineOfChars<(char)45>()::line == '\0') {
    uRam0000000000259040 = 0x2d2d2d2d2d2d2d;
    uRam0000000000259047._0_1_ = '-';
    uRam0000000000259047._1_1_ = '-';
    uRam0000000000259047._2_1_ = '-';
    uRam0000000000259047._3_1_ = '-';
    uRam0000000000259047._4_1_ = '-';
    uRam0000000000259047._5_1_ = '-';
    uRam0000000000259047._6_1_ = '-';
    uRam0000000000259047._7_1_ = '-';
    DAT_00259030 = '-';
    DAT_00259030_1._0_1_ = '-';
    DAT_00259030_1._1_1_ = '-';
    DAT_00259030_1._2_1_ = '-';
    DAT_00259030_1._3_1_ = '-';
    DAT_00259030_1._4_1_ = '-';
    DAT_00259030_1._5_1_ = '-';
    DAT_00259030_1._6_1_ = '-';
    uRam0000000000259038 = 0x2d2d2d2d2d2d2d;
    DAT_0025903f = 0x2d;
    DAT_00259020 = '-';
    DAT_00259020_1._0_1_ = '-';
    DAT_00259020_1._1_1_ = '-';
    DAT_00259020_1._2_1_ = '-';
    DAT_00259020_1._3_1_ = '-';
    DAT_00259020_1._4_1_ = '-';
    DAT_00259020_1._5_1_ = '-';
    DAT_00259020_1._6_1_ = '-';
    uRam0000000000259028._0_1_ = '-';
    uRam0000000000259028._1_1_ = '-';
    uRam0000000000259028._2_1_ = '-';
    uRam0000000000259028._3_1_ = '-';
    uRam0000000000259028._4_1_ = '-';
    uRam0000000000259028._5_1_ = '-';
    uRam0000000000259028._6_1_ = '-';
    uRam0000000000259028._7_1_ = '-';
    DAT_00259010 = '-';
    DAT_00259010_1._0_1_ = '-';
    DAT_00259010_1._1_1_ = '-';
    DAT_00259010_1._2_1_ = '-';
    DAT_00259010_1._3_1_ = '-';
    DAT_00259010_1._4_1_ = '-';
    DAT_00259010_1._5_1_ = '-';
    DAT_00259010_1._6_1_ = '-';
    uRam0000000000259018._0_1_ = '-';
    uRam0000000000259018._1_1_ = '-';
    uRam0000000000259018._2_1_ = '-';
    uRam0000000000259018._3_1_ = '-';
    uRam0000000000259018._4_1_ = '-';
    uRam0000000000259018._5_1_ = '-';
    uRam0000000000259018._6_1_ = '-';
    uRam0000000000259018._7_1_ = '-';
    getLineOfChars<(char)45>()::line = '-';
    getLineOfChars<(char)45>()::line_1._0_1_ = '-';
    getLineOfChars<(char)45>()::line_1._1_1_ = '-';
    getLineOfChars<(char)45>()::line_1._2_1_ = '-';
    getLineOfChars<(char)45>()::line_1._3_1_ = '-';
    getLineOfChars<(char)45>()::line_1._4_1_ = '-';
    getLineOfChars<(char)45>()::line_1._5_1_ = '-';
    getLineOfChars<(char)45>()::line_1._6_1_ = '-';
    uRam0000000000259008._0_1_ = '-';
    uRam0000000000259008._1_1_ = '-';
    uRam0000000000259008._2_1_ = '-';
    uRam0000000000259008._3_1_ = '-';
    uRam0000000000259008._4_1_ = '-';
    uRam0000000000259008._5_1_ = '-';
    uRam0000000000259008._6_1_ = '-';
    uRam0000000000259008._7_1_ = '-';
    DAT_0025904f = 0;
  }
  uStack_18 = in_RAX;
  sVar2 = strlen(&getLineOfChars<(char)45>()::line);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,&getLineOfChars<(char)45>()::line,sVar2)
  ;
  uStack_18 = CONCAT17(10,(undefined7)uStack_18);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)((long)&uStack_18 + 7),1);
  return;
}

Assistant:

void ConsoleReporter::printSummaryDivider() {
    stream << getLineOfChars<'-'>() << '\n';
}